

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O3

int q1_path(int srow,int scol,int y2,int x2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int x;
  int y;
  int iVar4;
  char **ppcVar5;
  long lVar6;
  int iVar7;
  
  iVar4 = x2 - scol;
  iVar7 = srow - y2;
  iVar1 = iVar4 * 2;
  iVar2 = iVar7 * 2;
  if (iVar4 < iVar7) {
    if (iVar7 != 1) {
      uVar3 = iVar1 - iVar7;
      ppcVar5 = viz_clear_rows + srow;
      iVar4 = (y2 - srow) + 1;
      do {
        ppcVar5 = ppcVar5 + -1;
        scol = scol - ((int)~uVar3 >> 0x1f);
        if ((*ppcVar5)[scol] == '\0') {
          return 0;
        }
        iVar7 = 0;
        if (-1 < (int)uVar3) {
          iVar7 = iVar2;
        }
        uVar3 = (uVar3 + iVar1) - iVar7;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
    }
  }
  else if (iVar4 != 1) {
    uVar3 = iVar2 - iVar4;
    lVar6 = (long)scol;
    iVar4 = (scol - x2) + 1;
    do {
      srow = ((int)~uVar3 >> 0x1f) + srow;
      if (viz_clear_rows[srow][lVar6 + 1] == '\0') {
        return 0;
      }
      iVar7 = 0;
      if (-1 < (int)uVar3) {
        iVar7 = iVar1;
      }
      uVar3 = (uVar3 + iVar2) - iVar7;
      lVar6 = lVar6 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return 1;
}

Assistant:

static int q1_path(int srow, int scol, int y2, int x2)
{
    int dx, dy;
    int k, err, x, y, dxs, dys;

    x  = scol;		y  = srow;
    dx = x2 - x;	dy = y - y2;

    dxs = dx << 1;	   /* save the shifted values */
    dys = dy << 1;
    if (dy > dx) {
	err = dxs - dy;

	for (k = dy-1; k; k--) {
	    if (err >= 0) {
		x++;
		err -= dys;
	    }
	    y--;
	    err += dxs;
	    if (!is_clear(y,x)) return 0; /* blocked */
	}
    } else {
	err = dys - dx;

	for (k = dx-1; k; k--) {
	    if (err >= 0) {
		y--;
		err -= dxs;
	    }
	    x++;
	    err += dys;
	    if (!is_clear(y,x)) return 0;/* blocked */
	}
    }

    return 1;
}